

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::BuildVertexIndicesImpl
          (RenderSceneConverter *this,RenderMesh *mesh)

{
  string *psVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer paVar5;
  pointer paVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pfVar9;
  pointer pfVar10;
  array<float,_3UL> *paVar11;
  array<float,_3UL> *paVar12;
  iterator __position;
  pointer puVar13;
  array<float,_3UL> *paVar14;
  void *pvVar15;
  array<float,_3UL> *paVar16;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var17;
  size_t sVar18;
  VertexAttribute *pVVar19;
  VertexAttribute *pVVar20;
  ulong uVar21;
  mapped_type *pmVar22;
  pointer puVar23;
  size_type sVar24;
  mapped_type *pmVar25;
  ostream *poVar26;
  uint *puVar27;
  long lVar28;
  uint *puVar29;
  size_type __n;
  size_t k;
  long lVar30;
  pointer puVar31;
  uint *puVar32;
  char *pcVar33;
  pointer puVar34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar35;
  ulong uVar36;
  unsigned_long *args_1;
  VertexAttribute *pVVar37;
  ulong uVar38;
  __node_base *p_Var39;
  long lVar40;
  pointer piVar41;
  RenderMesh *pRVar42;
  long lVar43;
  _Hash_node_base *p_Var44;
  bool bVar45;
  size_t num_fvs;
  vector<float,_std::allocator<float>_> tmp_weights;
  size_t fvi;
  uint32_t orgPointIdx;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> tmpNormalOffsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmpPointIndices;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  pointIdxRemap;
  DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> vertex_output;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_point_indices;
  ostringstream ss_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_indices;
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> vertex_input;
  VertexAttribute *local_490;
  vector<float,_std::allocator<float>_> local_488;
  VertexAttribute *local_468;
  _Hash_node_base *local_460;
  undefined1 local_458 [32];
  RenderMesh *local_438;
  pointer local_430;
  pointer local_428;
  key_type_conflict1 local_41c;
  void *local_418;
  iterator iStack_410;
  array<float,_3UL> *local_408;
  pointer local_3f8;
  _Hash_node_base *local_3f0;
  pointer local_3e8;
  iterator iStack_3e0;
  uint *local_3d8;
  unsigned_long *local_3c8;
  pointer local_3c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3b8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3b0;
  undefined1 local_378 [32];
  pointer local_358;
  pointer local_348;
  pointer local_340;
  pointer local_330;
  pointer local_328;
  pointer local_318;
  pointer local_310;
  pointer local_300;
  pointer local_2f8;
  pointer local_2e8;
  pointer local_2e0;
  pointer local_2d0;
  pointer local_2c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2b8;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_298;
  value_type local_290 [9];
  ios_base local_220 [264];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_f8;
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> local_f0;
  
  pvVar35 = &mesh->triangulatedFaceVertexIndices;
  if ((mesh->triangulatedFaceVertexIndices).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (mesh->triangulatedFaceVertexIndices).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pvVar35 = &mesh->usdFaceVertexIndices;
  }
  memset(&local_f0,0,0xc0);
  local_490 = (VertexAttribute *)
              ((long)(pvVar35->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar35->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&local_f0.point_indices,pvVar35);
  local_290[0]._M_elems[0] = 0.0;
  local_290[0]._M_elems[1] = 0.0;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::_M_fill_assign
            (&local_f0.uv0s,(size_type)local_490,(value_type *)local_290);
  local_290[0]._M_elems[0] = 0.0;
  local_290[0]._M_elems[1] = 0.0;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::_M_fill_assign
            (&local_f0.uv1s,(size_type)local_490,(value_type *)local_290);
  local_290[0]._M_elems[0] = 0.0;
  local_290[0]._M_elems[1] = 0.0;
  local_290[0]._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&local_f0.normals,(size_type)local_490,local_290);
  local_290[0]._M_elems[0] = 0.0;
  local_290[0]._M_elems[1] = 0.0;
  local_290[0]._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&local_f0.tangents,(size_type)local_490,local_290);
  local_290[0]._M_elems[0] = 0.0;
  local_290[0]._M_elems[1] = 0.0;
  local_290[0]._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&local_f0.binormals,(size_type)local_490,local_290);
  local_290[0]._M_elems[0] = 0.0;
  local_290[0]._M_elems[1] = 0.0;
  local_290[0]._M_elems[2] = 0.0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&local_f0.colors,(size_type)local_490,local_290);
  local_290[0]._M_elems._0_8_ = local_290[0]._M_elems._0_8_ & 0xffffffff00000000;
  ::std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (&local_f0.opacities,(size_type)local_490,local_290[0]._M_elems);
  pVVar20 = &mesh->normals;
  sVar18 = VertexAttribute::vertex_count(pVVar20);
  if (sVar18 == 0) {
LAB_003407e4:
    local_298 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mesh->texcoords;
    p_Var39 = &(mesh->texcoords)._M_h._M_before_begin;
    psVar1 = &this->_err;
    local_460 = (_Hash_node_base *)0x0;
    local_3f0 = (_Hash_node_base *)0x0;
    local_468 = pVVar20;
    local_438 = mesh;
    local_3b8 = &mesh->triangulatedFaceVertexIndices;
    local_f8 = &mesh->usdFaceVertexIndices;
    do {
      p_Var39 = p_Var39->_M_nxt;
      if (p_Var39 == (__node_base *)0x0) break;
      sVar18 = VertexAttribute::vertex_count((VertexAttribute *)(p_Var39 + 2));
      bVar45 = true;
      if (sVar18 != 0) {
        if (*(int *)&p_Var39[0xe]._M_nxt == 4) {
          pVVar20 = (VertexAttribute *)
                    VertexAttribute::vertex_count((VertexAttribute *)(p_Var39 + 2));
          if (pVVar20 == local_490) {
            if ((int)*(size_type *)(p_Var39 + 1) == 1) {
              local_460 = p_Var39[8]._M_nxt;
            }
            else if ((int)*(size_type *)(p_Var39 + 1) == 0) {
              local_3f0 = p_Var39[8]._M_nxt;
            }
            goto LAB_00340a69;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
          poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0x9df);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
          lVar40 = 0x61;
          pcVar33 = 
          "Internal error. The number of texcoord items does not match with the number of facevarying items."
          ;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
          poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0x9da);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
          lVar40 = 0x3c;
          pcVar33 = "Internal error. texcoords must be \'facevarying\' variability.";
        }
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar33,lVar40);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)psVar1,local_378._0_8_);
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
        ::std::ios_base::~ios_base(local_220);
        bVar45 = false;
      }
LAB_00340a69:
    } while (bVar45);
    pRVar42 = local_438;
    if (p_Var39 == (__node_base *)0x0) {
      if (local_3f0 == (_Hash_node_base *)0x0) {
        local_430 = (pointer)0x0;
        local_428 = (pointer)0x0;
LAB_00340d96:
        pVVar20 = &pRVar42->vertex_colors;
        sVar18 = VertexAttribute::vertex_count(pVVar20);
        if (sVar18 == 0) {
LAB_00340dcb:
          sVar18 = VertexAttribute::vertex_count(&pRVar42->vertex_opacities);
          if (sVar18 == 0) {
LAB_00340e00:
            local_3c8 = (unsigned_long *)VertexAttribute::vertex_count(local_468);
            if (local_3c8 != (unsigned_long *)0x0) {
              local_3c8 = (unsigned_long *)
                          (pRVar42->normals).data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            }
            local_3c0 = (pointer)VertexAttribute::vertex_count(pVVar20);
            if (local_3c0 != (pointer)0x0) {
              local_3c0 = (pRVar42->vertex_colors).data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            }
            local_3f8 = (pointer)VertexAttribute::vertex_count(&pRVar42->vertex_opacities);
            if (local_3f8 != (pointer)0x0) {
              local_3f8 = (pRVar42->vertex_opacities).data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            }
            if (local_490 != (VertexAttribute *)0x0) {
              lVar40 = 0;
              pVVar20 = (VertexAttribute *)0x0;
              puVar23 = local_428;
              puVar31 = local_430;
              puVar34 = local_3c0;
              args_1 = local_3c8;
              do {
                pVVar19 = local_490;
                local_458._0_8_ =
                     ZEXT48((pvVar35->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[(long)pVVar20]);
                if ((ulong)local_458._0_8_ < local_490) {
                  if (args_1 != (unsigned_long *)0x0) {
                    *(undefined4 *)
                     ((long)(local_f0.normals.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar40 + 8) =
                         *(undefined4 *)((long)args_1 + lVar40 + 8);
                    *(undefined8 *)
                     ((long)(local_f0.normals.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar40) =
                         *(undefined8 *)((long)args_1 + lVar40);
                  }
                  if (local_3f0 != (_Hash_node_base *)0x0) {
                    *(_Hash_node_base **)
                     local_f0.uv0s.
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pVVar20]._M_elems =
                         local_3f0[(long)pVVar20]._M_nxt;
                  }
                  if (local_460 != (_Hash_node_base *)0x0) {
                    *(_Hash_node_base **)
                     local_f0.uv1s.
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pVVar20]._M_elems =
                         local_460[(long)pVVar20]._M_nxt;
                  }
                  if (puVar23 != (pointer)0x0) {
                    *(undefined4 *)
                     ((long)(local_f0.tangents.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar40 + 8) =
                         *(undefined4 *)(puVar23 + lVar40 + 8);
                    *(undefined8 *)
                     ((long)(local_f0.tangents.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar40) =
                         *(undefined8 *)(puVar23 + lVar40);
                  }
                  if (puVar31 != (pointer)0x0) {
                    *(undefined4 *)
                     ((long)(local_f0.binormals.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar40 + 8) =
                         *(undefined4 *)(puVar31 + lVar40 + 8);
                    *(undefined8 *)
                     ((long)(local_f0.binormals.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar40) =
                         *(undefined8 *)(puVar31 + lVar40);
                  }
                  if (puVar34 != (pointer)0x0) {
                    *(undefined4 *)
                     ((long)(local_f0.colors.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar40 + 8) =
                         *(undefined4 *)(puVar34 + lVar40 + 8);
                    *(undefined8 *)
                     ((long)(local_f0.colors.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar40) =
                         *(undefined8 *)(puVar34 + lVar40);
                  }
                  pVVar37 = (VertexAttribute *)local_458._0_8_;
                  if (local_3f8 != (pointer)0x0) {
                    local_f0.opacities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)pVVar20] =
                         *(float *)(local_3f8 + (long)pVVar20 * 4);
                  }
                }
                else {
                  local_468 = (VertexAttribute *)local_458._0_8_;
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_290,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_290,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                             ,0x5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3)
                  ;
                  poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa3d);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
                  local_3b0._M_buckets = (__buckets_ptr)&local_3b0._M_before_begin;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3b0,"Invalid faceVertexIndex {}. Must be less than {}"
                             ,"");
                  fmt::format<unsigned_long,unsigned_long>
                            ((string *)local_378,(fmt *)&local_3b0,(string *)local_458,
                             (unsigned_long *)&local_490,args_1);
                  poVar26 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_290,(char *)local_378._0_8_,local_378._8_8_)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\n",1);
                  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
                  }
                  if ((__node_base *)local_3b0._M_buckets != &local_3b0._M_before_begin) {
                    operator_delete(local_3b0._M_buckets,
                                    (ulong)((long)&(local_3b0._M_before_begin._M_nxt)->_M_nxt + 1));
                  }
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append((char *)psVar1,local_378._0_8_);
                  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
                  ::std::ios_base::~ios_base(local_220);
                  puVar23 = local_428;
                  puVar31 = local_430;
                  puVar34 = local_3c0;
                  args_1 = local_3c8;
                  pVVar37 = local_468;
                }
                if (pVVar19 <= pVVar37) goto LAB_003418eb;
                pVVar20 = (VertexAttribute *)((long)&(pVVar20->name)._M_dataplus._M_p + 1);
                lVar40 = lVar40 + 0xc;
              } while (pVVar20 < local_490);
            }
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (uint *)0x0;
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (uint *)0x0;
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            memset((DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_378,0,0xc0
                  );
            BuildIndices<tinyusdz::tydra::DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>,tinyusdz::tydra::DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>,tinyusdz::tydra::DefaultPackedVertexData,tinyusdz::tydra::DefaultPackedVertexDataHasher,tinyusdz::tydra::DefaultPackedVertexDataEqual>
                      (&local_f0,
                       (DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_378,
                       &local_118,&local_2b8);
            pRVar42 = local_438;
            if ((long)local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                (long)local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
              pvVar35 = local_3b8;
              if ((local_438->triangulatedFaceVertexCounts).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  (local_438->triangulatedFaceVertexCounts).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pvVar35 = local_f8;
              }
              if ((local_438->triangulatedFaceVertexIndices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  (local_438->triangulatedFaceVertexIndices).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pvVar35 = local_f8;
              }
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (pvVar35,&local_118);
              p_Var44 = local_460;
              puVar27 = local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1;
              puVar29 = local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              puVar32 = local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (puVar27 !=
                  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
                  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                do {
                  puVar32 = puVar27;
                  if (*puVar27 <= *puVar29) {
                    puVar32 = puVar29;
                  }
                  puVar27 = puVar27 + 1;
                  puVar29 = puVar32;
                } while (puVar27 !=
                         local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
              }
              uVar2 = *puVar32;
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     local_458,(ulong)(uVar2 + 1),(allocator_type *)local_290);
              if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar21 = 0;
                do {
                  uVar38 = (ulong)local_2b8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar21];
                  paVar5 = (pRVar42->points).
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar36 = ((long)(pRVar42->points).
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 2) *
                           -0x5555555555555555;
                  if (uVar36 < uVar38 || uVar36 - uVar38 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,"():",3);
                    poVar26 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_290,0xa7e);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,"Internal error. point index out-of-range.",0x29
                              );
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_3b0._M_buckets);
                    if ((__node_base *)local_3b0._M_buckets != &local_3b0._M_before_begin) {
                      operator_delete(local_3b0._M_buckets,
                                      (ulong)((long)&(local_3b0._M_before_begin._M_nxt)->_M_nxt + 1)
                                     );
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
                    ::std::ios_base::~ios_base(local_220);
                    goto LAB_003423cb;
                  }
                  uVar3 = local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar21];
                  *(float *)(local_458._0_8_ + (ulong)uVar3 * 0xc + 8) = paVar5[uVar38]._M_elems[2];
                  *(undefined8 *)(local_458._0_8_ + (ulong)uVar3 * 0xc) =
                       *(undefined8 *)paVar5[uVar38]._M_elems;
                  uVar21 = uVar21 + 1;
                } while (uVar21 < (ulong)((long)local_2b8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_2b8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 2));
              }
              pVVar20 = (VertexAttribute *)
                        (pRVar42->points).
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              paVar5 = (pRVar42->points).
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              paVar6 = (pRVar42->points).
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (pRVar42->points).
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_458._0_8_;
              (pRVar42->points).
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_458._8_8_;
              (pRVar42->points).
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_458._16_8_;
              local_458._0_8_ = pVVar20;
              local_458._8_8_ = paVar5;
              local_458._16_8_ = paVar6;
              if (pVVar20 != (VertexAttribute *)0x0) {
                operator_delete(pVVar20,(long)paVar6 - (long)pVVar20);
              }
              if (*(pointer *)
                   ((long)&(pRVar42->joint_and_weights).jointIndices.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8) !=
                  (pRVar42->joint_and_weights).jointIndices.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start) {
                iVar4 = (pRVar42->joint_and_weights).elementSize;
                lVar40 = (long)iVar4;
                if (lVar40 < 1) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_290,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_290,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                             ,0x5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3)
                  ;
                  poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa88);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
                  pcVar33 = "Internal error. Invalid elementSize in mesh.joint_and_weights.";
                  lVar40 = 0x3e;
                  goto LAB_00341648;
                }
                __n = (ulong)(uVar2 + 1) * lVar40;
                ::std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)local_458,__n,
                           (allocator_type *)local_290);
                ::std::vector<float,_std::allocator<float>_>::vector
                          (&local_488,__n,(allocator_type *)local_290);
                pRVar42 = local_438;
                if ((long)local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start != 0) {
                  lVar28 = (long)local_2b8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2b8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2;
                  piVar7 = (local_438->joint_and_weights).jointIndices.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  piVar8 = *(pointer *)
                            ((long)&(local_438->joint_and_weights).jointIndices.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + 8);
                  local_468 = (VertexAttribute *)local_458._0_8_;
                  pfVar9 = *(pointer *)
                            ((long)&(local_438->joint_and_weights).jointWeights.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data + 8);
                  pfVar10 = (local_438->joint_and_weights).jointWeights.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  local_3b8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start;
                  lVar43 = 0;
                  do {
                    lVar30 = lVar40;
                    pVVar20 = (VertexAttribute *)local_458._0_8_;
                    piVar41 = piVar7;
                    if ((ulong)((long)piVar8 - (long)piVar7 >> 2) <=
                        (ulong)(local_2b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar43] * iVar4)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,"():",3);
                      poVar26 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_290,0xa91);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
                      pcVar33 = "Internal error. point index exceeds jointIndices.size.";
LAB_003427f4:
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,pcVar33,0x36);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,"\n",1);
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_3b0._M_buckets);
                      if ((__node_base *)local_3b0._M_buckets != &local_3b0._M_before_begin) {
                        operator_delete(local_3b0._M_buckets,
                                        (ulong)((long)&(local_3b0._M_before_begin._M_nxt)->_M_nxt +
                                               1));
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
                      ::std::ios_base::~ios_base(local_220);
                      if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start !=
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                        operator_delete(local_488.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_488.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_488.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
LAB_003423cb:
                      if ((VertexAttribute *)local_458._0_8_ != (VertexAttribute *)0x0) {
                        operator_delete((void *)local_458._0_8_,local_458._16_8_ - local_458._0_8_);
                      }
                      goto LAB_003416cd;
                    }
                    do {
                      *(_Rb_tree_color *)
                       ((long)&(pVVar20->name)._M_dataplus._M_p +
                       (ulong)local_118.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar43] * lVar40 * 4) =
                           *(_Rb_tree_color *)
                            ((long)piVar41 +
                            (ulong)local_2b8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar43] * lVar40 * 4);
                      piVar41 = piVar41 + 1;
                      pVVar20 = (VertexAttribute *)((long)&(pVVar20->name)._M_dataplus._M_p + 4);
                      lVar30 = lVar30 + -1;
                    } while (lVar30 != 0);
                    uVar2 = local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar43];
                    if ((ulong)((long)pfVar9 - (long)pfVar10 >> 2) <= (ulong)(uVar2 * iVar4)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_290,"():",3);
                      poVar26 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_290,0xa9c);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
                      pcVar33 = "Internal error. point index exceeds jointWeights.size.";
                      goto LAB_003427f4;
                    }
                    uVar3 = local_118.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar43];
                    lVar30 = 0;
                    do {
                      *(float *)((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           *)local_488.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                        super__Vector_impl_data._M_start +
                                lVar30 * 4 + (ulong)uVar3 * lVar40 * 4) =
                           pfVar10[(ulong)uVar2 * lVar40 + lVar30];
                      lVar30 = lVar30 + 1;
                    } while (lVar40 != lVar30);
                    lVar43 = lVar43 + 1;
                  } while (lVar43 != lVar28 + (ulong)(lVar28 == 0));
                }
                pVVar20 = (VertexAttribute *)
                          (local_438->joint_and_weights).jointIndices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                paVar6 = *(pointer *)
                          ((long)&(local_438->joint_and_weights).jointIndices.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + 8);
                paVar5 = *(pointer *)
                          ((long)&(local_438->joint_and_weights).jointIndices.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + 0x10);
                (local_438->joint_and_weights).jointIndices.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)local_458._0_8_;
                *(undefined8 *)
                 ((long)&(local_438->joint_and_weights).jointIndices.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8) = local_458._8_8_;
                *(undefined8 *)
                 ((long)&(local_438->joint_and_weights).jointIndices.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 0x10) = local_458._16_8_;
                pvVar35 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (local_438->joint_and_weights).jointWeights.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start;
                paVar11 = *(array<float,_3UL> **)
                           ((long)&(local_438->joint_and_weights).jointWeights.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data + 8);
                paVar12 = *(array<float,_3UL> **)
                           ((long)&(local_438->joint_and_weights).jointWeights.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data + 0x10);
                (local_438->joint_and_weights).jointWeights.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start = local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start;
                *(pointer *)
                 ((long)&(local_438->joint_and_weights).jointWeights.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data + 8) =
                     local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                *(pointer *)
                 ((long)&(local_438->joint_and_weights).jointWeights.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data + 0x10) =
                     local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pvVar35;
                local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = paVar11->_M_elems;
                local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = paVar12->_M_elems;
                local_458._0_8_ = pVVar20;
                local_458._8_8_ = paVar6;
                local_458._16_8_ = paVar5;
                if (pvVar35 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  operator_delete(pvVar35,(long)paVar12 - (long)pvVar35);
                }
                p_Var44 = local_460;
                if ((VertexAttribute *)local_458._0_8_ != (VertexAttribute *)0x0) {
                  operator_delete((void *)local_458._0_8_,local_458._16_8_ - local_458._0_8_);
                }
              }
              if ((pRVar42->targets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                local_3b0._M_buckets = &local_3b0._M_single_bucket;
                local_3b0._M_bucket_count = 1;
                local_3b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                local_3b0._M_element_count = 0;
                local_3b0._M_rehash_policy._M_max_load_factor = 1.0;
                local_3b0._M_rehash_policy._M_next_resize = 0;
                local_3b0._M_single_bucket = (__node_base_ptr)0x0;
                if (local_378._8_8_ != local_378._0_8_) {
                  lVar40 = 0;
                  uVar21 = 0;
                  do {
                    pmVar22 = ::std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)&local_3b0,(key_type *)(local_378._0_8_ + lVar40));
                    local_290[0]._M_elems[0] = (float)(uint)uVar21;
                    __position._M_current =
                         (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>(pmVar22,__position,(uint *)local_290);
                    }
                    else {
                      *__position._M_current = (uint)uVar21;
                      (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                    }
                    uVar21 = uVar21 + 1;
                    lVar40 = lVar40 + 4;
                  } while (uVar21 < (ulong)((long)(local_378._8_8_ - local_378._0_8_) >> 2));
                }
                pVVar20 = (VertexAttribute *)
                          (pRVar42->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                local_468 = (VertexAttribute *)
                            &(pRVar42->targets)._M_t._M_impl.super__Rb_tree_header;
                if (pVVar20 != local_468) {
                  do {
                    local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_408 = (array<float,_3UL> *)0x0;
                    local_418 = (void *)0x0;
                    iStack_410._M_current = (array<float,_3UL> *)0x0;
                    local_3d8 = (uint *)0x0;
                    local_3e8 = (pointer)0x0;
                    iStack_3e0._M_current = (uint *)0x0;
                    puVar23 = pVVar20[1].data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    bVar45 = pVVar20[1].data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish != puVar23;
                    if (bVar45) {
                      uVar21 = 0;
                      do {
                        local_41c = *(key_type_conflict1 *)(puVar23 + uVar21 * 4);
                        sVar24 = ::std::
                                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 ::count(&local_3b0,&local_41c);
                        if (sVar24 == 0) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_290,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_290,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                     ,0x5b);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_290,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_290,"():",3);
                          poVar26 = (ostream *)
                                    ::std::ostream::operator<<((ostringstream *)local_290,0xabf);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
                          pcVar33 = "Invalid pointIndices value.";
LAB_003425d3:
                          lVar40 = 0x1b;
LAB_003425d8:
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_290,pcVar33,lVar40);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_290,"\n",1);
                          ::std::__cxx11::stringbuf::str();
                          ::std::__cxx11::string::_M_append((char *)psVar1,local_458._0_8_);
                          if ((VertexAttribute *)local_458._0_8_ !=
                              (VertexAttribute *)(local_458 + 0x10)) {
                            operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
                          ::std::ios_base::~ios_base(local_220);
                          if (local_3e8 != (pointer)0x0) {
                            operator_delete(local_3e8,(long)local_3d8 - (long)local_3e8);
                          }
                          if (local_418 != (void *)0x0) {
                            operator_delete(local_418,(long)local_408 - (long)local_418);
                          }
                          if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start !=
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                            operator_delete(local_488.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start,
                                            (long)local_488.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_488.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                          }
                          goto LAB_003426a5;
                        }
                        pmVar22 = ::std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_3b0,&local_41c);
                        if ((pmVar22->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish !=
                            (pmVar22->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start) {
                          lVar40 = 0;
                          uVar38 = 0;
                          do {
                            puVar13 = pVVar20[1].indices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            lVar28 = (long)pVVar20[1].indices.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar13;
                            if (lVar28 != 0) {
                              if ((ulong)((lVar28 >> 2) * -0x5555555555555555) <= uVar21) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_290);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           ,0x5b);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,"():",3);
                                poVar26 = (ostream *)
                                          ::std::ostream::operator<<
                                                    ((ostringstream *)local_290,0xac6);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
                                pcVar33 = "Invalid pointOffsets.size.";
                                lVar40 = 0x1a;
                                goto LAB_003425d8;
                              }
                              paVar11 = (array<float,_3UL> *)(puVar13 + uVar21 * 3);
                              if (local_488.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_488.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                ::std::
                                vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                ::_M_realloc_insert<std::array<float,3ul>const&>
                                          ((vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                            *)&local_488,
                                           (iterator)
                                           local_488.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_finish,paVar11);
                              }
                              else {
                                local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish[2] = paVar11->_M_elems[2];
                                *(undefined8 *)
                                 local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish =
                                     *(undefined8 *)paVar11->_M_elems;
                                local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish =
                                     (pointer)((long)local_488.
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish + 0xc);
                              }
                            }
                            lVar28 = pVVar20[1].handle - *(long *)&pVVar20[1].variability;
                            if (lVar28 != 0) {
                              if ((ulong)((lVar28 >> 2) * -0x5555555555555555) <= uVar21) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_290);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           ,0x5b);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_290,"():",3);
                                poVar26 = (ostream *)
                                          ::std::ostream::operator<<
                                                    ((ostringstream *)local_290,0xacc);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
                                pcVar33 = "Invalid normalOffsets.size.";
                                goto LAB_003425d3;
                              }
                              paVar11 = (array<float,_3UL> *)
                                        (*(long *)&pVVar20[1].variability + uVar21 * 0xc);
                              if (iStack_410._M_current == local_408) {
                                ::std::
                                vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                ::_M_realloc_insert<std::array<float,3ul>const&>
                                          ((vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                            *)&local_418,iStack_410,paVar11);
                              }
                              else {
                                (iStack_410._M_current)->_M_elems[2] = paVar11->_M_elems[2];
                                *(undefined8 *)(iStack_410._M_current)->_M_elems =
                                     *(undefined8 *)paVar11->_M_elems;
                                iStack_410._M_current = iStack_410._M_current + 1;
                              }
                            }
                            puVar29 = (uint *)((long)(pmVar22->
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                              lVar40);
                            if (iStack_3e0._M_current == local_3d8) {
                              ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                              _M_realloc_insert<unsigned_int_const&>
                                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                                         &local_3e8,iStack_3e0,puVar29);
                            }
                            else {
                              *iStack_3e0._M_current = *puVar29;
                              iStack_3e0._M_current = iStack_3e0._M_current + 1;
                            }
                            uVar38 = uVar38 + 1;
                            lVar40 = lVar40 + 4;
                          } while (uVar38 < (ulong)((long)(pmVar22->
                                                                                                                    
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar22->
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 2));
                        }
                        uVar21 = uVar21 + 1;
                        puVar23 = pVVar20[1].data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        bVar45 = uVar21 < (ulong)((long)pVVar20[1].data.
                                                                                                                
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)puVar23 >> 2);
                      } while (bVar45);
                    }
                    puVar23 = pVVar20[1].data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    puVar29 = (uint *)pVVar20[1].data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish;
                    puVar32 = (uint *)pVVar20[1].data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    pVVar20[1].data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start = local_3e8;
                    pVVar20[1].data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)iStack_3e0._M_current;
                    pVVar20[1].data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)local_3d8;
                    pvVar35 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              pVVar20[1].indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    paVar14 = (array<float,_3UL> *)
                              pVVar20[1].indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                    paVar11 = (array<float,_3UL> *)
                              pVVar20[1].indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
                    pVVar20[1].indices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)local_488.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                    pVVar20[1].indices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         (pointer)local_488.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_finish;
                    pVVar20[1].indices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_488.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                    pvVar15 = *(void **)&pVVar20[1].variability;
                    paVar16 = (array<float,_3UL> *)pVVar20[1].handle;
                    paVar12 = (array<float,_3UL> *)pVVar20[2].name._M_dataplus._M_p;
                    *(void **)&pVVar20[1].variability = local_418;
                    pVVar20[1].handle = (uint64_t)iStack_410._M_current;
                    pVVar20[2].name._M_dataplus._M_p = (pointer)local_408;
                    local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)pvVar35;
                    local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)paVar14;
                    local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)paVar11;
                    local_418 = pvVar15;
                    iStack_410._M_current = paVar16;
                    local_408 = paVar12;
                    local_3e8 = puVar23;
                    iStack_3e0._M_current = puVar29;
                    local_3d8 = puVar32;
                    if (puVar23 != (pointer)0x0) {
                      operator_delete(puVar23,(long)puVar32 - (long)puVar23);
                    }
                    if (local_418 != (void *)0x0) {
                      operator_delete(local_418,(long)local_408 - (long)local_418);
                    }
                    pRVar42 = local_438;
                    if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        local_488.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start !=
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                      operator_delete(local_488.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_488.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_488.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar45) {
LAB_003426a5:
                      ::std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::~_Hashtable(&local_3b0);
                      goto LAB_003416cd;
                    }
                    pVVar20 = (VertexAttribute *)
                              ::std::_Rb_tree_increment((_Rb_tree_node_base *)pVVar20);
                  } while (pVVar20 != local_468);
                }
                ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::~_Hashtable(&local_3b0);
                p_Var44 = local_460;
              }
              if (local_3c8 != (unsigned_long *)0x0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &(pRVar42->normals).data,(long)local_358 - local_378._24_8_);
                memcpy((pRVar42->normals).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,(void *)local_378._24_8_,
                       (long)local_358 - local_378._24_8_);
                (pRVar42->normals).variability = Vertex;
              }
              p_Var17 = local_298;
              if (local_3f0 != (_Hash_node_base *)0x0) {
                local_290[0]._M_elems._0_8_ = local_290[0]._M_elems._0_8_ & 0xffffffff00000000;
                pmVar25 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_298,(key_type *)local_290);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pmVar25->data,
                           (long)local_340 - (long)local_348);
                memcpy((pmVar25->data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,local_348,(long)local_340 - (long)local_348)
                ;
                p_Var44 = local_460;
                local_290[0]._M_elems._0_8_ = local_290[0]._M_elems._0_8_ & 0xffffffff00000000;
                pmVar25 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](p_Var17,(key_type *)local_290);
                pmVar25->variability = Vertex;
              }
              p_Var17 = local_298;
              if (p_Var44 != (_Hash_node_base *)0x0) {
                local_290[0]._M_elems[0] = 1.4013e-45;
                pmVar25 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_298,(key_type *)local_290);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pmVar25->data,
                           (long)local_328 - (long)local_330);
                memcpy((pmVar25->data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,local_330,(long)local_328 - (long)local_330)
                ;
                local_290[0]._M_elems[0] = 1.4013e-45;
                pmVar25 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](p_Var17,(key_type *)local_290);
                pmVar25->variability = Vertex;
              }
              if (local_428 != (pointer)0x0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &(pRVar42->tangents).data,(long)local_310 - (long)local_318);
                memcpy((pRVar42->tangents).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,local_318,(long)local_310 - (long)local_318)
                ;
                (pRVar42->tangents).variability = Vertex;
              }
              if (local_430 != (pointer)0x0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &(pRVar42->binormals).data,(long)local_2f8 - (long)local_300);
                memcpy((pRVar42->binormals).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,local_300,(long)local_2f8 - (long)local_300)
                ;
                (pRVar42->binormals).variability = Vertex;
              }
              if (local_3c0 != (pointer)0x0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &(pRVar42->vertex_colors).data,(long)local_2e0 - (long)local_2e8);
                memcpy((pRVar42->vertex_colors).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,local_2e8,(long)local_2e0 - (long)local_2e8)
                ;
                (pRVar42->vertex_colors).variability = Vertex;
              }
              bVar45 = true;
              if (local_3f8 != (pointer)0x0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &(pRVar42->vertex_opacities).data,(long)local_2c8 - (long)local_2d0);
                memcpy((pRVar42->vertex_opacities).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,local_2d0,(long)local_2c8 - (long)local_2d0)
                ;
                (pRVar42->vertex_opacities).variability = Vertex;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_290,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
              poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa63);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
              pcVar33 = "Internal error. out_indices.size != out_point_indices.";
              lVar40 = 0x36;
LAB_00341648:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_290,pcVar33,lVar40);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_3b0._M_buckets);
              if ((__node_base *)local_3b0._M_buckets != &local_3b0._M_before_begin) {
                operator_delete(local_3b0._M_buckets,
                                (ulong)((long)&(local_3b0._M_before_begin._M_nxt)->_M_nxt + 1));
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
              ::std::ios_base::~ios_base(local_220);
LAB_003416cd:
              bVar45 = false;
            }
            DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>::~DefaultVertexOutput
                      ((DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> *)local_378);
            if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_2b8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2b8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
              operator_delete(local_118.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_118.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_118.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_003418ed;
          }
          if ((pRVar42->vertex_opacities).variability == FaceVarying) {
            pVVar19 = (VertexAttribute *)VertexAttribute::vertex_count(pVVar20);
            if (pVVar19 == local_490) goto LAB_00340e00;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                       ,0x5b);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
            poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa25);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
            pcVar33 = 
            "Internal error. The number of vertex_opacity items does not match with the number of facevarying items."
            ;
            lVar40 = 0x67;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                       ,0x5b);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
            poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa20);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
            pcVar33 = "Internal error. vertex_opacities must be \'facevarying\' variability.";
            lVar40 = 0x43;
          }
        }
        else if ((pRVar42->vertex_colors).variability == FaceVarying) {
          pVVar19 = (VertexAttribute *)VertexAttribute::vertex_count(pVVar20);
          if (pVVar19 == local_490) goto LAB_00340dcb;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
          poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa18);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
          pcVar33 = 
          "Internal error. The number of vertex_color items does not match with the number of facevarying items."
          ;
          lVar40 = 0x65;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
          poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa13);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
          pcVar33 = "Internal error. vertex_colors must be \'facevarying\' variability.";
          lVar40 = 0x40;
        }
      }
      else {
        pVVar20 = &local_438->tangents;
        sVar18 = VertexAttribute::vertex_count(pVVar20);
        if (sVar18 == 0) {
          local_428 = (pointer)0x0;
LAB_00340c9d:
          sVar18 = VertexAttribute::vertex_count(&pRVar42->binormals);
          if (sVar18 == 0) {
            local_430 = (pointer)0x0;
            goto LAB_00340d96;
          }
          if ((pRVar42->binormals).variability == FaceVarying) {
            pVVar20 = (VertexAttribute *)VertexAttribute::vertex_count(&pRVar42->binormals);
            if (pVVar20 == local_490) {
              local_430 = (pRVar42->binormals).data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              goto LAB_00340d96;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                       ,0x5b);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
            poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa09);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
            pcVar33 = 
            "Internal error. The number of binormals items does not match with the number of facevarying items."
            ;
            lVar40 = 0x62;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                       ,0x5b);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
            poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0xa04);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
            pcVar33 = "Internal error. binormals must be \'facevarying\' variability.";
            lVar40 = 0x3c;
          }
        }
        else if ((pRVar42->tangents).variability == FaceVarying) {
          pVVar20 = (VertexAttribute *)VertexAttribute::vertex_count(pVVar20);
          if (pVVar20 == local_490) {
            local_428 = (pRVar42->tangents).data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
            goto LAB_00340c9d;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
          poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0x9fa);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
          pcVar33 = 
          "Internal error. The number of tangents items does not match with the number of facevarying items."
          ;
          lVar40 = 0x61;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
          poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0x9f5);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
          pcVar33 = "Internal error. tangents must be \'facevarying\' variability.";
          lVar40 = 0x3b;
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar33,lVar40);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"\n",1);
      ::std::__cxx11::stringbuf::str();
      goto LAB_003418a5;
    }
  }
  else {
    if ((mesh->normals).variability == FaceVarying) {
      pVVar19 = (VertexAttribute *)VertexAttribute::vertex_count(pVVar20);
      if (pVVar19 == local_490) goto LAB_003407e4;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
      poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0x9cf);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
      pcVar33 = 
      "Internal error. The number of normal items does not match with the number of facevarying items."
      ;
      lVar40 = 0x5f;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_290,"BuildVertexIndicesImpl",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"():",3);
      poVar26 = (ostream *)::std::ostream::operator<<((ostringstream *)local_290,0x9ca);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar26," ",1);
      pcVar33 = "Internal error. normals must be \'facevarying\' variability.";
      lVar40 = 0x3a;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,pcVar33,lVar40);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"\n",1);
    ::std::__cxx11::stringbuf::str();
LAB_003418a5:
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_378._0_8_);
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
    ::std::ios_base::~ios_base(local_220);
  }
LAB_003418eb:
  bVar45 = false;
LAB_003418ed:
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>::~DefaultVertexInput(&local_f0);
  return bVar45;
}

Assistant:

bool RenderSceneConverter::BuildVertexIndicesImpl(RenderMesh &mesh) {
  //
  // - If mesh is triangulated, use triangulatedFaceVertexIndices, otherwise use
  // faceVertxIndices.
  // - Make vertex attributes 'facevarying' variability
  // - Assign same id for similar(currently identitical) vertex attribute.
  // - Reorder vertex attributes to 'vertex' variability.
  //

  const std::vector<uint32_t> &fvIndices =
      mesh.triangulatedFaceVertexIndices.size()
          ? mesh.triangulatedFaceVertexIndices
          : mesh.usdFaceVertexIndices;

  DefaultVertexInput<DefaultPackedVertexData> vertex_input;

  size_t num_fvs = fvIndices.size();
  vertex_input.point_indices = fvIndices;
  vertex_input.uv0s.assign(num_fvs, {0.0f, 0.0f});
  vertex_input.uv1s.assign(num_fvs, {0.0f, 0.0f});
  vertex_input.normals.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.tangents.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.binormals.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.colors.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.opacities.assign(num_fvs, 0.0f);

  if (mesh.normals.vertex_count()) {
    if (!mesh.normals.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. normals must be 'facevarying' variability.");
    }
    if (mesh.normals.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of normal items does not match with "
          "the number of facevarying items.");
    }
  }

  const value::float2 *texcoord0_ptr = nullptr;
  const value::float2 *texcoord1_ptr = nullptr;

  for (const auto &it : mesh.texcoords) {
    if (it.second.vertex_count() > 0) {
      if (!it.second.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. texcoords must be 'facevarying' variability.");
      }
      if (it.second.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of texcoord items does not match "
            "with the number of facevarying items.");
      }

      if (it.first == 0) {
        texcoord0_ptr = reinterpret_cast<const value::float2 *>(
            it.second.get_data().data());
      } else if (it.first == 1) {
        texcoord1_ptr = reinterpret_cast<const value::float2 *>(
            it.second.get_data().data());
      } else {
        // ignore.
      }
    }
  }

  const value::float3 *tangents_ptr = nullptr;
  const value::float3 *binormals_ptr = nullptr;

  if (texcoord0_ptr) {
    if (mesh.tangents.vertex_count()) {
      if (!mesh.tangents.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. tangents must be 'facevarying' variability.");
      }
      if (mesh.tangents.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of tangents items does not match "
            "with the number of facevarying items.");
      }

      tangents_ptr = reinterpret_cast<const value::float3 *>(
          mesh.tangents.get_data().data());
    }

    if (mesh.binormals.vertex_count()) {
      if (!mesh.binormals.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. binormals must be 'facevarying' variability.");
      }
      if (mesh.binormals.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of binormals items does not match "
            "with the number of facevarying items.");
      }
      binormals_ptr = reinterpret_cast<const value::float3 *>(
          mesh.binormals.get_data().data());
    }
  }

  if (mesh.vertex_colors.vertex_count()) {
    if (!mesh.vertex_colors.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. vertex_colors must be 'facevarying' variability.");
    }
    if (mesh.vertex_colors.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of vertex_color items does not match "
          "with the number of facevarying items.");
    }
  }

  if (mesh.vertex_opacities.vertex_count()) {
    if (!mesh.vertex_opacities.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. vertex_opacities must be 'facevarying' "
          "variability.");
    }
    if (mesh.vertex_colors.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of vertex_opacity items does not match "
          "with the number of facevarying items.");
    }
  }

  const value::float3 *normals_ptr =
      (mesh.normals.vertex_count() > 0)
          ? reinterpret_cast<const value::float3 *>(
                mesh.normals.get_data().data())
          : nullptr;
  const value::float3 *colors_ptr =
      (mesh.vertex_colors.vertex_count() > 0)
          ? reinterpret_cast<const value::float3 *>(
                mesh.vertex_colors.get_data().data())
          : nullptr;
  const float *opacities_ptr =
      (mesh.vertex_opacities.vertex_count() > 0)
          ? reinterpret_cast<const float *>(
                mesh.vertex_opacities.get_data().data())
          : nullptr;

  for (size_t i = 0; i < num_fvs; i++) {
    size_t fvi = fvIndices[i];
    if (fvi >= num_fvs) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Invalid faceVertexIndex {}. Must be less than {}", fvi, num_fvs));
    }

    if (normals_ptr) {
      vertex_input.normals[i] = normals_ptr[i];
    }
    if (texcoord0_ptr) {
      vertex_input.uv0s[i] = texcoord0_ptr[i];
    }
    if (texcoord1_ptr) {
      vertex_input.uv1s[i] = texcoord1_ptr[i];
    }
    if (tangents_ptr) {
      vertex_input.tangents[i] = tangents_ptr[i];
    }
    if (binormals_ptr) {
      vertex_input.binormals[i] = binormals_ptr[i];
    }
    if (colors_ptr) {
      vertex_input.colors[i] = colors_ptr[i];
    }
    if (opacities_ptr) {
      vertex_input.opacities[i] = opacities_ptr[i];
    }
  }

  std::vector<uint32_t> out_indices;
  std::vector<uint32_t> out_point_indices;  // to reorder position data
  DefaultVertexOutput<DefaultPackedVertexData> vertex_output;

  BuildIndices<DefaultVertexInput<DefaultPackedVertexData>,
               DefaultVertexOutput<DefaultPackedVertexData>,
               DefaultPackedVertexData, DefaultPackedVertexDataHasher,
               DefaultPackedVertexDataEqual>(vertex_input, vertex_output,
                                             out_indices, out_point_indices);

  if (out_indices.size() != out_point_indices.size()) {
    PUSH_ERROR_AND_RETURN(
        "Internal error. out_indices.size != out_point_indices.");
  }

  DCOUT("faceVertexIndices.size : " << fvIndices.size());
  DCOUT("# of indices after the build: "
        << out_indices.size() << ", reduced "
        << (fvIndices.size() - out_indices.size()) << " indices.");

  if (mesh.is_triangulated()) {
    mesh.triangulatedFaceVertexIndices = out_indices;
  } else {
    mesh.usdFaceVertexIndices = out_indices;
  }

  //
  // Reorder 'vertex' varying attributes(points, jointIndices/jointWeights,
  // BlendShape points, ...)
  // TODO: Preserve input order as much as possible.
  //
  {
    uint32_t numPoints =
        *std::max_element(out_indices.begin(), out_indices.end()) + 1;
    {
      std::vector<value::float3> tmp_points(numPoints);
      // TODO: Use vertex_output[i].point_index?
      for (size_t i = 0; i < out_point_indices.size(); i++) {
        if (out_point_indices[i] >= mesh.points.size()) {
          PUSH_ERROR_AND_RETURN("Internal error. point index out-of-range.");
        }
        tmp_points[out_indices[i]] = mesh.points[out_point_indices[i]];
      }
      mesh.points.swap(tmp_points);
    }

    if (mesh.joint_and_weights.jointIndices.size()) {
      if (mesh.joint_and_weights.elementSize < 1) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. Invalid elementSize in mesh.joint_and_weights.");
      }
      uint32_t elementSize = uint32_t(mesh.joint_and_weights.elementSize);
      std::vector<int> tmp_indices(size_t(numPoints) * size_t(elementSize));
      std::vector<float> tmp_weights(size_t(numPoints) * size_t(elementSize));
      for (size_t i = 0; i < out_point_indices.size(); i++) {
        if ((elementSize * out_point_indices[i]) >=
            mesh.joint_and_weights.jointIndices.size()) {
          PUSH_ERROR_AND_RETURN(
              "Internal error. point index exceeds jointIndices.size.");
        }
        for (size_t k = 0; k < elementSize; k++) {
          tmp_indices[size_t(elementSize) * size_t(out_indices[i]) + k] =
              mesh.joint_and_weights
                  .jointIndices[size_t(elementSize) * size_t(out_point_indices[i]) + k];
        }

        if ((elementSize * out_point_indices[i]) >=
            mesh.joint_and_weights.jointWeights.size()) {
          PUSH_ERROR_AND_RETURN(
              "Internal error. point index exceeds jointWeights.size.");
        }

        for (size_t k = 0; k < elementSize; k++) {
          tmp_weights[size_t(elementSize) * size_t(out_indices[i]) + k] =
              mesh.joint_and_weights
                  .jointWeights[size_t(elementSize) * size_t(out_point_indices[i]) + k];
        }
      }
      mesh.joint_and_weights.jointIndices.swap(tmp_indices);
      mesh.joint_and_weights.jointWeights.swap(tmp_weights);
    }

    if (mesh.targets.size()) {
      // For BlendShape, reordering pointIndices, pointOffsets and normalOffsets is not enough.
      // Some points could be duplicated, so we need to find a mapping of org pointIdx -> pointIdx list in reordered points,
      // Then splat point attributes accordingly.

      // org pointIdx -> List of pointIdx in reordered points.
      std::unordered_map<uint32_t, std::vector<uint32_t>> pointIdxRemap;

      for (size_t i = 0; i < vertex_output.size(); i++) {
        pointIdxRemap[vertex_output.point_indices[i]].push_back(uint32_t(i));
      }

      for (auto &target : mesh.targets) {

        std::vector<value::float3> tmpPointOffsets;
        std::vector<value::float3> tmpNormalOffsets;
        std::vector<uint32_t> tmpPointIndices;

        for (size_t i = 0; i < target.second.pointIndices.size(); i++) {

          uint32_t orgPointIdx = target.second.pointIndices[i];
          if (!pointIdxRemap.count(orgPointIdx)) {
            PUSH_ERROR_AND_RETURN("Invalid pointIndices value.");
          }
          const std::vector<uint32_t> &dstPointIndices = pointIdxRemap.at(orgPointIdx);

          for (size_t k = 0; k < dstPointIndices.size(); k++) {
            if (target.second.pointOffsets.size()) {
              if (i >= target.second.pointOffsets.size()) {
                PUSH_ERROR_AND_RETURN("Invalid pointOffsets.size.");
              }
              tmpPointOffsets.push_back(target.second.pointOffsets[i]);
            }
            if (target.second.normalOffsets.size()) {
              if (i >= target.second.normalOffsets.size()) {
                PUSH_ERROR_AND_RETURN("Invalid normalOffsets.size.");
              }
              tmpNormalOffsets.push_back(target.second.normalOffsets[i]);
            }

            tmpPointIndices.push_back(dstPointIndices[k]);
          }
        }

        target.second.pointIndices.swap(tmpPointIndices);
        target.second.pointOffsets.swap(tmpPointOffsets);
        target.second.normalOffsets.swap(tmpNormalOffsets);

      }

      // TODO: Inbetween BlendShapes

    }

  }

  // Other 'facevarying' attributes are now 'vertex' variability
  if (normals_ptr) {
    mesh.normals.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.normals.data()),
        vertex_output.normals.size() * sizeof(value::float3));
    mesh.normals.variability = VertexVariability::Vertex;
  }

  if (texcoord0_ptr) {
    mesh.texcoords[0].set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.uv0s.data()),
        vertex_output.uv0s.size() * sizeof(value::float2));
    mesh.texcoords[0].variability = VertexVariability::Vertex;
  }

  if (texcoord1_ptr) {
    mesh.texcoords[1].set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.uv1s.data()),
        vertex_output.uv1s.size() * sizeof(value::float2));
    mesh.texcoords[1].variability = VertexVariability::Vertex;
  }

  if (tangents_ptr) {
    mesh.tangents.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.tangents.data()),
        vertex_output.tangents.size() * sizeof(value::float3));
    mesh.tangents.variability = VertexVariability::Vertex;
  }

  if (binormals_ptr) {
    mesh.binormals.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.binormals.data()),
        vertex_output.binormals.size() * sizeof(value::float3));
    mesh.binormals.variability = VertexVariability::Vertex;
  }

  if (colors_ptr) {
    mesh.vertex_colors.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.colors.data()),
        vertex_output.colors.size() * sizeof(value::float3));
    mesh.vertex_colors.variability = VertexVariability::Vertex;
  }

  if (opacities_ptr) {
    mesh.vertex_opacities.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.opacities.data()),
        vertex_output.opacities.size() * sizeof(float));
    mesh.vertex_opacities.variability = VertexVariability::Vertex;
  }

  return true;
}